

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ninja.cc
# Opt level: O3

void anon_unknown.dwarf_3da::PrintCommands(Edge *edge,EdgeSet *seen,PrintCommandMode mode)

{
  bool bVar1;
  pointer ppNVar2;
  pair<std::_Rb_tree_iterator<Edge_*>,_bool> pVar3;
  Edge *local_40;
  string local_38;
  
  if (edge != (Edge *)0x0) {
    local_40 = edge;
    pVar3 = std::_Rb_tree<Edge*,Edge*,std::_Identity<Edge*>,EdgeCmp,std::allocator<Edge*>>::
            _M_insert_unique<Edge*const&>
                      ((_Rb_tree<Edge*,Edge*,std::_Identity<Edge*>,EdgeCmp,std::allocator<Edge*>> *)
                       seen,&local_40);
    if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      if (mode == PCM_All) {
        for (ppNVar2 = (local_40->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                       _M_impl.super__Vector_impl_data._M_start;
            ppNVar2 !=
            (local_40->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_finish; ppNVar2 = ppNVar2 + 1) {
          PrintCommands((*ppNVar2)->in_edge_,seen,PCM_All);
        }
      }
      bVar1 = Edge::is_phony(local_40);
      if (!bVar1) {
        Edge::EvaluateCommand_abi_cxx11_(&local_38,local_40,false);
        puts(local_38._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_38._M_dataplus._M_p != &local_38.field_2) {
          operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
        }
      }
    }
  }
  return;
}

Assistant:

void PrintCommands(Edge* edge, EdgeSet* seen, PrintCommandMode mode) {
  if (!edge)
    return;
  if (!seen->insert(edge).second)
    return;

  if (mode == PCM_All) {
    for (vector<Node*>::iterator in = edge->inputs_.begin();
         in != edge->inputs_.end(); ++in)
      PrintCommands((*in)->in_edge(), seen, mode);
  }

  if (!edge->is_phony())
    puts(edge->EvaluateCommand().c_str());
}